

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O3

String * __thiscall
Rml::EventDispatcher::ToString_abi_cxx11_(String *__return_storage_ptr__,EventDispatcher *this)

{
  pointer pEVar1;
  EventId id;
  EventSpecification *pEVar2;
  uint uVar3;
  const_iterator __begin1;
  pointer pEVar4;
  const_iterator __end1;
  String local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar4 = (this->listeners).
           super__Vector_base<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->listeners).
           super__Vector_base<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar4 != pEVar1) {
    id = pEVar4->id;
    uVar3 = 0;
    do {
      if (pEVar4->id == id) {
        uVar3 = uVar3 + 1;
      }
      else {
        pEVar2 = EventSpecificationInterface::Get(id);
        CreateString_abi_cxx11_(&local_50,"%s (%d), ",(pEVar2->type)._M_dataplus._M_p,(ulong)uVar3);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        id = pEVar4->id;
        uVar3 = 1;
      }
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar1);
    pEVar2 = EventSpecificationInterface::Get(id);
    CreateString_abi_cxx11_(&local_50,"%s (%d), ",(pEVar2->type)._M_dataplus._M_p,(ulong)uVar3);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (2 < __return_storage_ptr__->_M_string_length) {
      ::std::__cxx11::string::resize
                ((ulong)__return_storage_ptr__,(char)__return_storage_ptr__->_M_string_length + -2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String EventDispatcher::ToString() const
{
	String result;

	if (listeners.empty())
		return result;

	auto add_to_result = [&result](EventId id, int count) {
		const EventSpecification& specification = EventSpecificationInterface::Get(id);
		result += CreateString("%s (%d), ", specification.type.c_str(), count);
	};

	EventId previous_id = listeners[0].id;
	int count = 0;
	for (const auto& listener : listeners)
	{
		if (listener.id != previous_id)
		{
			add_to_result(previous_id, count);
			previous_id = listener.id;
			count = 0;
		}
		count++;
	}

	if (count > 0)
		add_to_result(previous_id, count);

	if (result.size() > 2)
		result.resize(result.size() - 2);

	return result;
}